

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall
Alg::max_cover_lazy_budget
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double *timeb,int mode)

{
  allocator<bool> *paVar1;
  _Bit_pointer *ppuVar2;
  size_t sVar3;
  value_type vVar4;
  double dVar5;
  double dVar6;
  size_type sVar7;
  reference pvVar8;
  pointer pvVar9;
  reference pvVar10;
  reference pvVar11;
  ostream *poVar12;
  reference pvVar13;
  size_type sVar14;
  const_reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  type_conflict *ptVar19;
  type_conflict1 *ptVar20;
  unsigned_long uVar21;
  ulong uVar22;
  reference puVar23;
  reference puVar24;
  iterator iVar25;
  iterator iVar26;
  uint uVar27;
  long lVar28;
  bool bVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  pair<unsigned_int,_double> pVar41;
  pair<unsigned_long,_double> pVar42;
  reference rVar43;
  double finalInf_cost;
  double local_4f0;
  pair<unsigned_long,_double> *local_4e0;
  pair<unsigned_long,_double> *local_4d8;
  size_type local_4d0;
  size_type idxup;
  value_type *vecNodeup;
  size_t degup;
  iterator iStack_4b0;
  uint nodeIdx_1;
  iterator __end5_1;
  iterator __begin5_1;
  value_type *__range5_1;
  _Bit_type local_490;
  reference local_488;
  size_type local_478;
  unsigned_long edgeIdx_1;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  _Bit_type local_450;
  value_type_conflict local_444;
  uint *local_440;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_438;
  uint *local_430;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_428;
  value_type_conflict local_41c;
  value_type_conflict local_418;
  value_type_conflict local_414;
  value_type_conflict local_410;
  value_type_conflict local_40c;
  value_type_conflict local_408 [2];
  pair<unsigned_long,_double> *local_400;
  pair<unsigned_long,_double> *local_3f8;
  value_type_conflict local_3ec;
  value_type_conflict local_3e8;
  value_type_conflict local_3e4;
  value_type_conflict local_3e0;
  value_type_conflict local_3dc;
  value_type_conflict local_3d8 [2];
  pair<unsigned_long,_double> *local_3d0;
  pair<unsigned_long,_double> *local_3c8;
  size_type local_3c0;
  size_t miss_idx;
  bool is_stop;
  size_type sStack_3b0;
  int miss_idxBound;
  size_type idxBound_1;
  double vecBound_Budget;
  Nodelist vecBound_1;
  size_t degBound_1;
  double local_378;
  value_type *local_370;
  size_t currDeg_1;
  type_conflict argmaxIdx_1;
  size_type idx_1;
  value_type *vecNode_1;
  pair<unsigned_long,_double> *local_348;
  pair<unsigned_long,_double> *local_340;
  value_type *local_338;
  size_t deg_2;
  Timer timerBound;
  undefined1 local_308 [8];
  vector<bool,_std::allocator<bool>_> node_sel_cost;
  undefined1 local_2d8 [8];
  vector<bool,_std::allocator<bool>_> edgeMark_cost;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  miss_nodes_vec;
  double sumBudget_cost;
  size_t sumInf_cost;
  double local_280;
  pair<unsigned_long,_double> local_278;
  uint32_t local_268;
  allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  local_261;
  uint32_t i_4;
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  degMap_cost;
  uint32_t i_3;
  size_t deg_cost;
  value_type *pvStack_230;
  uint32_t i_2;
  size_t maxDeg_cost;
  value_type_conflict4 local_220;
  undefined1 local_218 [8];
  vector<double,_std::allocator<double>_> coverage_cost;
  double finalInf;
  iterator iStack_1f0;
  uint nodeIdx;
  iterator __end6;
  iterator __begin6;
  value_type *__range6;
  _Bit_type local_1d0;
  reference local_1c8;
  size_type local_1b8;
  unsigned_long edgeIdx;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  value_type_conflict local_184;
  size_type local_180;
  size_type idxBound;
  Nodelist vecBound;
  size_t degBound;
  value_type currDeg;
  size_type sStack_148;
  value_type argmaxIdx;
  size_type idx;
  value_type *vecNode;
  size_t deg_1;
  double min_cost;
  undefined1 local_120 [8];
  vector<bool,_std::allocator<bool>_> node_sel;
  undefined1 local_f0 [8];
  vector<bool,_std::allocator<bool>_> edgeMark;
  ulong uStack_c0;
  int flag;
  size_t sumInf;
  uint32_t i_1;
  RRsets degMap;
  size_t deg;
  value_type *pvStack_88;
  uint32_t i;
  size_t maxDeg;
  allocator<unsigned_long> local_69;
  value_type_conflict2 local_68;
  undefined1 local_60 [8];
  FRset coverage;
  double EPS;
  int mode_local;
  double *timeb_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  Alg *this_local;
  
  coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3ddb7cdfd9d7bdbb;
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  uVar27 = this->__numV;
  local_68 = 0;
  std::allocator<unsigned_long>::allocator(&local_69);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,(ulong)uVar27,
             &local_68,&local_69);
  std::allocator<unsigned_long>::~allocator(&local_69);
  pvStack_88 = (value_type *)0x0;
  deg._4_4_ = this->__numV;
  while (uVar27 = deg._4_4_ - 1, deg._4_4_ != 0) {
    pvVar8 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&(this->__hyperG)._FRsets,(ulong)uVar27);
    pvVar9 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar9;
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                         (ulong)uVar27);
    *pvVar10 = (value_type)pvVar9;
    deg._4_4_ = uVar27;
    if (pvStack_88 <
        degMap.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pvStack_88 = degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sumInf + 7));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&i_1,(size_type)
                   ((long)&(pvStack_88->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1),
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
           ((long)&sumInf + 7));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sumInf + 7));
  sumInf._0_4_ = this->__numV;
  while (uVar27 = (uint32_t)sumInf - 1, (uint32_t)sumInf != 0) {
    sumInf._0_4_ = uVar27;
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                         (ulong)uVar27);
    if (*pvVar10 != 0) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                           (ulong)(uint32_t)sumInf);
      pvVar11 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)&i_1,*pvVar10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar11,(value_type_conflict *)&sumInf);
    }
  }
  uStack_c0 = 0;
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  sVar14 = this->__numRRsets;
  node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  paVar1 = (allocator<bool> *)
           ((long)&node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage + 6);
  sumInf._0_4_ = uVar27;
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_f0,sVar14,
             (bool *)((long)&node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),paVar1);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&node_sel.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  uVar27 = this->__numV;
  min_cost._7_1_ = 0;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&min_cost + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_120,(ulong)uVar27,
             (bool *)((long)&min_cost + 7),(allocator<bool> *)((long)&min_cost + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&min_cost + 6));
  deg_1 = (size_t)min_vector_nonzero_mask
                            (budget_list,(vector<bool,_std::allocator<bool>_> *)local_120);
  poVar12 = std::operator<<((ostream *)&std::cout,"min_cost: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,(double)deg_1);
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed_inf);
  vecNode = pvStack_88;
  while ((vecNode != (value_type *)0x0 && ((double)deg_1 <= budget))) {
    idx = (size_type)
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&i_1,(size_type)vecNode);
    sStack_148 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx);
    do {
      while( true ) {
        sVar14 = sStack_148 - 1;
        bVar29 = sStack_148 == 0;
        sStack_148 = sVar14;
        if (bVar29) goto LAB_001084af;
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx,sVar14);
        currDeg._4_4_ = *pvVar13;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                             (ulong)currDeg._4_4_);
        if (vecNode <= (value_type *)*pvVar10) break;
        pvVar11 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)&i_1,(size_type)*pvVar10);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar11,(value_type_conflict *)((long)&currDeg + 4));
      }
      pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                          (budget_list,(ulong)currDeg._4_4_);
      if (*pvVar15 <= budget) {
        if (mode == 2) {
          vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)vecNode;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
          local_180 = sStack_148;
          pvVar11 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)&i_1,(size_type)
                                         vecBound.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar11,local_180);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                               (ulong)*pvVar13);
          local_184 = (value_type_conflict)*pvVar10;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound,&local_184);
          iVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
          iVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
          uVar21 = std::
                   accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                             ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               )iVar25._M_current,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               )iVar26._M_current,0);
          lVar28 = uVar21 + uStack_c0;
          auVar31._8_4_ = (int)((ulong)lVar28 >> 0x20);
          auVar31._0_8_ = lVar28;
          auVar31._12_4_ = 0x45300000;
          sVar3 = this->__numRRsets;
          auVar37._8_4_ = (int)(sVar3 >> 0x20);
          auVar37._0_8_ = sVar3;
          auVar37._12_4_ = 0x45300000;
          this->__boundLast_inf =
               (((auVar31._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0)) *
               (double)this->__numV) /
               ((auVar37._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
          if (this->__boundLast_inf <= this->__boundMin_inf &&
              this->__boundMin_inf != this->__boundLast_inf) {
            this->__boundMin_inf = this->__boundLast_inf;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&idxBound);
        }
        if (edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._4_4_ == 0) {
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                               (ulong)currDeg._4_4_);
          uStack_c0 = uStack_c0 + *pvVar10;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->__vecSeed_inf,(value_type_conflict *)((long)&currDeg + 4));
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,
                               (ulong)currDeg._4_4_);
          *pvVar10 = 0;
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](&(this->__hyperG)._FRsets,(ulong)currDeg._4_4_);
          __end5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar8);
          edgeIdx = (unsigned_long)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar8);
          while( true ) {
            bVar29 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&edgeIdx);
            if (!bVar29) break;
            puVar23 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&__end5);
            local_1b8 = *puVar23;
            rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_f0,local_1b8);
            local_1c8 = rVar43;
            bVar29 = std::_Bit_reference::operator_cast_to_bool(&local_1c8);
            if (!bVar29) {
              rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_f0,local_1b8);
              local_1d0 = rVar43._M_mask;
              __range6 = (value_type *)rVar43._M_p;
              std::_Bit_reference::operator=((_Bit_reference *)&__range6,true);
              pvVar11 = std::
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ::operator[](&(this->__hyperG)._RRsets,local_1b8);
              __end6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar11);
              iStack_1f0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar11);
              while( true ) {
                bVar29 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffe10);
                if (!bVar29) break;
                puVar24 = __gnu_cxx::
                          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          ::operator*(&__end6);
                uVar27 = *puVar24;
                pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     local_60,(ulong)uVar27);
                if (*pvVar10 != 0) {
                  pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_60,(ulong)uVar27);
                  *pvVar10 = *pvVar10 - 1;
                }
                __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator++(&__end6);
              }
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end5);
          }
        }
        edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ =
             edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage._4_4_ + 1;
      }
    } while (edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage._4_4_ != 2);
LAB_001084af:
    if (edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ == 2) break;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)&i_1);
    vecNode = (value_type *)
              ((long)&vecNode[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  }
  auVar32._8_4_ = (int)(uStack_c0 >> 0x20);
  auVar32._0_8_ = uStack_c0;
  auVar32._12_4_ = 0x45300000;
  sVar3 = this->__numRRsets;
  auVar38._8_4_ = (int)(sVar3 >> 0x20);
  auVar38._0_8_ = sVar3;
  auVar38._12_4_ = 0x45300000;
  coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((((auVar32._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uStack_c0) - 4503599627370496.0)) *
                 (double)this->__numV) /
                ((auVar38._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)));
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,uStack_c0);
  poVar12 = std::operator<<(poVar12," ");
  poVar12 = (ostream *)
            std::ostream::operator<<
                      (poVar12,(double)coverage_cost.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
  poVar12 = std::operator<<(poVar12,", min-bound: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->__boundMin_inf);
  poVar12 = std::operator<<(poVar12,", last-bound: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->__boundLast_inf);
  std::operator<<(poVar12,'\n');
  uVar27 = this->__numV;
  local_220 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&maxDeg_cost + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_218,(ulong)uVar27,&local_220,
             (allocator<double> *)((long)&maxDeg_cost + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&maxDeg_cost + 7));
  pvStack_230 = (value_type *)0x0;
  deg_cost._4_4_ = this->__numV;
  while (uVar27 = deg_cost._4_4_ - 1, deg_cost._4_4_ != 0) {
    pvVar8 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&(this->__hyperG)._FRsets,(ulong)uVar27);
    sVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(ulong)uVar27);
    deg_cost._4_4_ = uVar27;
    if ((ABS(*pvVar15) <= 1e-10) || (sVar14 == 0)) {
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_218,(ulong)uVar27);
      *pvVar16 = 0.0;
    }
    else {
      auVar33._8_4_ = (int)(sVar14 >> 0x20);
      auVar33._0_8_ = sVar14;
      auVar33._12_4_ = 0x45300000;
      pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(ulong)uVar27);
      dVar30 = *pvVar15;
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_218,(ulong)uVar27);
      *pvVar16 = ((auVar33._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar14) - 4503599627370496.0)) / dVar30;
    }
  }
  degMap_cost.
  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this->__numV;
  while (uVar27 = degMap_cost.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 1,
        degMap_cost.
        super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    degMap_cost.
    super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar27;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_218,(ulong)uVar27);
    if (pvStack_230 < (value_type *)(long)((int)*pvVar16 + 1)) {
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_218,
                           (ulong)degMap_cost.
                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pvStack_230 = (value_type *)(long)((int)*pvVar16 + 1);
    }
  }
  degMap_cost.
  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar27;
  poVar12 = std::operator<<((ostream *)&std::cout,"maxDeg: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,(ulong)pvStack_230);
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  std::
  allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  ::allocator(&local_261);
  std::
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ::vector((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            *)&i_4,(size_type)
                   ((long)&(pvStack_230->
                           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1),&local_261);
  std::
  allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  ::~allocator(&local_261);
  local_268 = this->__numV;
  while (uVar27 = local_268 - 1, local_268 != 0) {
    local_268 = uVar27;
    pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)local_218,(ulong)uVar27);
    if (1e-10 < ABS(*pvVar16)) {
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_218,(ulong)local_268);
      pvVar17 = std::
                vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              *)&i_4,(long)((int)*pvVar16 + 1));
      pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_218,(ulong)local_268);
      pVar41 = std::make_pair<unsigned_int&,double&>(&local_268,pvVar16);
      local_280 = pVar41.second;
      sumInf_cost._0_4_ = pVar41.first;
      std::pair<unsigned_long,_double>::pair<unsigned_int,_double,_true>
                (&local_278,(pair<unsigned_int,_double> *)&sumInf_cost);
      std::
      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
      push_back(pvVar17,&local_278);
    }
  }
  sumBudget_cost = 0.0;
  miss_nodes_vec.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = uVar27;
  std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ::vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage);
  sVar14 = this->__numRRsets;
  node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  paVar1 = (allocator<bool> *)
           ((long)&node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage + 6);
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_2d8,sVar14,
             (bool *)((long)&node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),paVar1);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&node_sel_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6));
  uVar27 = this->__numV;
  timerBound.__processName._7_1_ = 0;
  paVar1 = (allocator<bool> *)((long)&timerBound.__processName + 6);
  std::allocator<bool>::allocator(paVar1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_308,(ulong)uVar27,
             (bool *)((long)&timerBound.__processName + 7),paVar1);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&timerBound.__processName + 6));
  deg_1 = (size_t)min_vector_nonzero_mask
                            (budget_list,(vector<bool,_std::allocator<bool>_> *)local_308);
  Timer::Timer((Timer *)&deg_2,"Bound");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed_inf_cost);
  local_338 = pvStack_230;
  do {
    if ((local_338 == (value_type *)0x0) ||
       (budget < (double)miss_nodes_vec.
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + (double)deg_1)) {
      auVar36._8_4_ = (int)((ulong)sumBudget_cost >> 0x20);
      auVar36._0_8_ = sumBudget_cost;
      auVar36._12_4_ = 0x45300000;
      sVar3 = this->__numRRsets;
      auVar40._8_4_ = (int)(sVar3 >> 0x20);
      auVar40._0_8_ = sVar3;
      auVar40._12_4_ = 0x45300000;
      this_local = (Alg *)((((auVar36._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,SUB84(sumBudget_cost,0)) -
                            4503599627370496.0)) * (double)this->__numV) /
                          ((auVar40._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)));
      poVar12 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(ulong)sumBudget_cost);
      poVar12 = std::operator<<(poVar12," ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(double)this_local);
      poVar12 = std::operator<<(poVar12,", min-bound_cost: ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->__boundMin_inf_cost);
      poVar12 = std::operator<<(poVar12,", last-bound_cost: ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,this->__boundLast_inf_cost);
      std::operator<<(poVar12,'\n');
      if ((double)coverage_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage <= (double)this_local) {
        iVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&this->__vecSeed_inf_cost);
        iVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&this->__vecSeed_inf_cost);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        assign<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar25._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar26._M_current);
        poVar12 = std::operator<<((ostream *)&std::cout,"Cost Inf: ");
        sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar14);
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        this->__is_inf_cost = true;
      }
      else {
        iVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&this->__vecSeed_inf);
        iVar26 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->__vecSeed_inf)
        ;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        assign<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar25._M_current,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )iVar26._M_current);
        poVar12 = std::operator<<((ostream *)&std::cout,"Inf: ");
        sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar14);
        std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
        this->__is_inf_cost = false;
        this_local = (Alg *)coverage_cost.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_308);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_2d8);
      std::
      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
      ~vector((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
               *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
      ::~vector((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                 *)&i_4);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_218);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_120);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_f0);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&i_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
      return (double)this_local;
    }
    pvVar17 = std::
              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            *)&i_4,(size_type)local_338);
    local_340 = (pair<unsigned_long,_double> *)
                std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::begin(pvVar17);
    pvVar17 = std::
              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            *)&i_4,(size_type)local_338);
    local_348 = (pair<unsigned_long,_double> *)
                std::
                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ::end(pvVar17);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>
              (local_340,local_348);
    idx_1 = (size_type)
            std::
            vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          *)&i_4,(size_type)local_338);
    argmaxIdx_1 = std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::size((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          *)idx_1);
    do {
      while( true ) {
        sVar14 = argmaxIdx_1 - 1;
        bVar29 = argmaxIdx_1 == 0;
        argmaxIdx_1 = sVar14;
        if (bVar29) goto LAB_0010a4e5;
        pvVar18 = std::
                  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                *)idx_1,sVar14);
        ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
        currDeg_1 = *ptVar19;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_218,currDeg_1);
        local_370 = (value_type *)(long)((int)*pvVar16 + 1);
        if (local_338 <= local_370) break;
        pvVar17 = std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)local_370);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_218,currDeg_1);
        pVar42 = std::make_pair<unsigned_long&,double&>(&currDeg_1,pvVar16);
        local_378 = pVar42.second;
        degBound_1 = pVar42.first;
        std::
        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ::push_back(pvVar17,(value_type *)&degBound_1);
        pvVar17 = std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)local_338);
        std::
        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ::pop_back(pvVar17);
      }
      pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,currDeg_1);
      if ((double)miss_nodes_vec.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + *pvVar15 <= budget) {
        if (mode == 2) {
          Timer::get_operation_time((Timer *)&deg_2);
          vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_338;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
          idxBound_1 = 0;
          sStack_3b0 = argmaxIdx_1 + 1;
          sVar14 = std::
                   vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                   ::size((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage);
          miss_idx._4_4_ = (int)sVar14 + -1;
          miss_idx._3_1_ = 0;
          local_3c0 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::size((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage);
          while (sVar14 = local_3c0 - 1, local_3c0 != 0) {
            local_3c0 = sVar14;
            pvVar18 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                    *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_end_of_storage,sVar14);
            ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_218,*ptVar19);
            vVar4 = *pvVar16;
            pvVar18 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                    *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_end_of_storage,local_3c0)
            ;
            ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
            *ptVar20 = vVar4;
          }
          ppuVar2 = &edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_3c0 = sVar14;
          local_3c8 = (pair<unsigned_long,_double> *)
                      std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::begin((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               *)ppuVar2);
          local_3d0 = (pair<unsigned_long,_double> *)
                      std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::end((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             *)ppuVar2);
          std::
          sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>
                    (local_3c8,local_3d0);
          if ((miss_idx._3_1_ & 1) == 0) {
            while( true ) {
              while( true ) {
                sVar7 = idxBound_1;
                sVar14 = sStack_3b0;
                bVar29 = (double)idxBound_1 + (double)deg_1 <= budget;
                if (bVar29) {
                  sStack_3b0 = sStack_3b0 - 1;
                }
                if (!bVar29 || sVar14 == 0) goto LAB_001095d2;
                if (miss_idx._4_4_ < 0) break;
                pvVar17 = std::
                          vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                        *)&i_4,(size_type)
                                               vecBound_1.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar18 = std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::operator[](pvVar17,sStack_3b0);
                ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                dVar30 = *ptVar20;
                pvVar18 = std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                        *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_end_of_storage,
                                       (long)miss_idx._4_4_);
                ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                sVar14 = idxBound_1;
                if (dVar30 < *ptVar20) {
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          *)&edgeMark_cost.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_end_of_storage,
                                         (long)miss_idx._4_4_);
                  ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (budget_list,*ptVar19);
                  if (budget < (double)sVar14 + *pvVar15) {
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                            *)&edgeMark_cost.
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data._M_end_of_storage,
                                           (long)miss_idx._4_4_);
                    ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                    local_3e4 = (value_type_conflict)
                                (long)(*ptVar20 * (budget - (double)idxBound_1));
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vecBound_Budget,&local_3e4);
                    miss_idx._3_1_ = 1;
                    idxBound_1 = (size_type)budget;
                    goto LAB_001095d2;
                  }
                  ppuVar2 = &edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          *)ppuVar2,(long)miss_idx._4_4_);
                  ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                  dVar30 = *ptVar20;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          *)ppuVar2,(long)miss_idx._4_4_);
                  ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (budget_list,*ptVar19);
                  local_3e0 = (value_type_conflict)(long)(dVar30 * *pvVar15);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget
                             ,&local_3e0);
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          *)&edgeMark_cost.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_end_of_storage,
                                         (long)miss_idx._4_4_);
                  ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (budget_list,*ptVar19);
                  idxBound_1 = (size_type)(*pvVar15 + (double)idxBound_1);
                  miss_idx._4_4_ = miss_idx._4_4_ + -1;
                }
                else {
                  pvVar17 = std::
                            vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                          *)&i_4,(size_type)
                                                 vecBound_1.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  ;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[](pvVar17,sStack_3b0);
                  ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (budget_list,*ptVar19);
                  if (budget < (double)sVar14 + *pvVar15) {
                    pvVar17 = std::
                              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                            *)&i_4,(size_type)
                                                   vecBound_1.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[](pvVar17,sStack_3b0);
                    ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                    local_3dc = (value_type_conflict)
                                (long)(*ptVar20 * (budget - (double)idxBound_1));
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vecBound_Budget,&local_3dc);
                    miss_idx._3_1_ = 1;
                    idxBound_1 = (size_type)budget;
                    goto LAB_001095d2;
                  }
                  pvVar17 = std::
                            vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                          *)&i_4,(size_type)
                                                 vecBound_1.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  ;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[](pvVar17,sStack_3b0);
                  ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                  dVar30 = *ptVar20;
                  pvVar17 = std::
                            vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                          *)&i_4,(size_type)
                                                 vecBound_1.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  ;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[](pvVar17,sStack_3b0);
                  ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (budget_list,*ptVar19);
                  local_3d8[0] = (value_type_conflict)(long)(dVar30 * *pvVar15);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget
                             ,local_3d8);
                  pvVar17 = std::
                            vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                          *)&i_4,(size_type)
                                                 vecBound_1.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  ;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[](pvVar17,sStack_3b0);
                  ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                  pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (budget_list,*ptVar19);
                  idxBound_1 = (size_type)(*pvVar15 + (double)idxBound_1);
                }
              }
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar18 = std::
                        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ::operator[](pvVar17,sStack_3b0);
              ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
              pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (budget_list,*ptVar19);
              if (budget < (double)sVar7 + *pvVar15) break;
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar18 = std::
                        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ::operator[](pvVar17,sStack_3b0);
              ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
              dVar30 = *ptVar20;
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar18 = std::
                        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ::operator[](pvVar17,sStack_3b0);
              ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
              pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (budget_list,*ptVar19);
              local_3e8 = (value_type_conflict)(long)(dVar30 * *pvVar15);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                         &local_3e8);
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar18 = std::
                        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ::operator[](pvVar17,sStack_3b0);
              ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
              pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (budget_list,*ptVar19);
              idxBound_1 = (size_type)(*pvVar15 + (double)idxBound_1);
            }
            pvVar17 = std::
                      vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                    *)&i_4,(size_type)
                                           vecBound_1.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar18 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::operator[](pvVar17,sStack_3b0);
            ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
            local_3ec = (value_type_conflict)(long)(*ptVar20 * (budget - (double)idxBound_1));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                       &local_3ec);
            miss_idx._3_1_ = 1;
            idxBound_1 = (size_type)budget;
          }
LAB_001095d2:
          if ((miss_idx._3_1_ & 1) == 0) {
            do {
              bVar29 = false;
              if ((double)idxBound_1 + (double)deg_1 <= budget) {
                vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)((long)vecBound_1.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + -1);
                bVar29 = vecBound_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
              }
              if (!bVar29) break;
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_3f8 = (pair<unsigned_long,_double> *)
                          std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::begin(pvVar17);
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_400 = (pair<unsigned_long,_double> *)
                          std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::end(pvVar17);
              std::
              sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>
                        (local_3f8,local_400);
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              sStack_3b0 = std::
                           vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                           ::size(pvVar17);
              while( true ) {
                while( true ) {
                  sVar7 = idxBound_1;
                  sVar14 = sStack_3b0;
                  bVar29 = (double)idxBound_1 + (double)deg_1 <= budget;
                  if (bVar29) {
                    sStack_3b0 = sStack_3b0 - 1;
                  }
                  if (!bVar29 || sVar14 == 0) goto LAB_00109d35;
                  if (miss_idx._4_4_ < 0) break;
                  pvVar17 = std::
                            vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                            ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                          *)&i_4,(size_type)
                                                 vecBound_1.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                  ;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[](pvVar17,sStack_3b0);
                  ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                  dVar30 = *ptVar20;
                  pvVar18 = std::
                            vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          *)&edgeMark_cost.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_end_of_storage,
                                         (long)miss_idx._4_4_);
                  ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                  sVar14 = idxBound_1;
                  if (dVar30 < *ptVar20) {
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                            *)&edgeMark_cost.
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data._M_end_of_storage,
                                           (long)miss_idx._4_4_);
                    ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (budget_list,*ptVar19);
                    if (budget < (double)sVar14 + *pvVar15) {
                      pvVar18 = std::
                                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                              *)&edgeMark_cost.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_end_of_storage,
                                             (long)miss_idx._4_4_);
                      ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                      local_414 = (value_type_conflict)
                                  (long)(*ptVar20 * (budget - (double)idxBound_1));
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vecBound_Budget,&local_414);
                      miss_idx._3_1_ = 1;
                      idxBound_1 = (size_type)budget;
                      goto LAB_00109d35;
                    }
                    ppuVar2 = &edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage;
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                            *)ppuVar2,(long)miss_idx._4_4_);
                    ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                    dVar30 = *ptVar20;
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                            *)ppuVar2,(long)miss_idx._4_4_);
                    ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (budget_list,*ptVar19);
                    local_410 = (value_type_conflict)(long)(dVar30 * *pvVar15);
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vecBound_Budget,&local_410);
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                            *)&edgeMark_cost.
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data._M_end_of_storage,
                                           (long)miss_idx._4_4_);
                    ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (budget_list,*ptVar19);
                    idxBound_1 = (size_type)(*pvVar15 + (double)idxBound_1);
                    miss_idx._4_4_ = miss_idx._4_4_ + -1;
                  }
                  else {
                    pvVar17 = std::
                              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                            *)&i_4,(size_type)
                                                   vecBound_1.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[](pvVar17,sStack_3b0);
                    ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (budget_list,*ptVar19);
                    if (budget < (double)sVar14 + *pvVar15) {
                      pvVar17 = std::
                                vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                              *)&i_4,(size_type)
                                                     vecBound_1.
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            );
                      pvVar18 = std::
                                vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ::operator[](pvVar17,sStack_3b0);
                      ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                      local_40c = (value_type_conflict)
                                  (long)(*ptVar20 * (budget - (double)idxBound_1));
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vecBound_Budget,&local_40c);
                      miss_idx._3_1_ = 1;
                      idxBound_1 = (size_type)budget;
                      goto LAB_00109d35;
                    }
                    pvVar17 = std::
                              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                            *)&i_4,(size_type)
                                                   vecBound_1.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[](pvVar17,sStack_3b0);
                    ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                    dVar30 = *ptVar20;
                    pvVar17 = std::
                              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                            *)&i_4,(size_type)
                                                   vecBound_1.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[](pvVar17,sStack_3b0);
                    ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (budget_list,*ptVar19);
                    local_408[0] = (value_type_conflict)(long)(dVar30 * *pvVar15);
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vecBound_Budget,local_408);
                    pvVar17 = std::
                              vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                            *)&i_4,(size_type)
                                                   vecBound_1.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                    pvVar18 = std::
                              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ::operator[](pvVar17,sStack_3b0);
                    ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                        (budget_list,*ptVar19);
                    idxBound_1 = (size_type)(*pvVar15 + (double)idxBound_1);
                  }
                }
                pvVar17 = std::
                          vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                        *)&i_4,(size_type)
                                               vecBound_1.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar18 = std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::operator[](pvVar17,sStack_3b0);
                ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (budget_list,*ptVar19);
                if (budget < (double)sVar7 + *pvVar15) break;
                pvVar17 = std::
                          vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                        *)&i_4,(size_type)
                                               vecBound_1.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar18 = std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::operator[](pvVar17,sStack_3b0);
                ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
                dVar30 = *ptVar20;
                pvVar17 = std::
                          vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                        *)&i_4,(size_type)
                                               vecBound_1.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar18 = std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::operator[](pvVar17,sStack_3b0);
                ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (budget_list,*ptVar19);
                local_418 = (value_type_conflict)(long)(dVar30 * *pvVar15);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                           &local_418);
                pvVar17 = std::
                          vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                        *)&i_4,(size_type)
                                               vecBound_1.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar18 = std::
                          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ::operator[](pvVar17,sStack_3b0);
                ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
                pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (budget_list,*ptVar19);
                idxBound_1 = (size_type)(*pvVar15 + (double)idxBound_1);
              }
              pvVar17 = std::
                        vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                        ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                      *)&i_4,(size_type)
                                             vecBound_1.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar18 = std::
                        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ::operator[](pvVar17,sStack_3b0);
              ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
              local_41c = (value_type_conflict)(long)(*ptVar20 * (budget - (double)idxBound_1));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget,
                         &local_41c);
              miss_idx._3_1_ = 1;
              idxBound_1 = (size_type)budget;
LAB_00109d35:
            } while ((miss_idx._3_1_ & 1) != 1);
          }
          local_428._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &vecBound_Budget);
          local_430 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         &vecBound_Budget);
          std::
          sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (local_428,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )local_430);
          make_min_heap((Nodelist *)&vecBound_Budget);
          local_438._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &vecBound_Budget);
          local_440 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         &vecBound_Budget);
          uVar21 = std::
                   accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                             (local_438,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               )local_440,0);
          lVar28 = uVar21 + (long)sumBudget_cost;
          auVar34._8_4_ = (int)((ulong)lVar28 >> 0x20);
          auVar34._0_8_ = lVar28;
          auVar34._12_4_ = 0x45300000;
          sVar3 = this->__numRRsets;
          auVar39._8_4_ = (int)(sVar3 >> 0x20);
          auVar39._0_8_ = sVar3;
          auVar39._12_4_ = 0x45300000;
          this->__boundLast_inf_cost =
               (((auVar34._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0)) *
               (double)this->__numV) /
               ((auVar39._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
          if (this->__boundLast_inf_cost <= this->__boundMin_inf_cost &&
              this->__boundMin_inf_cost != this->__boundLast_inf_cost) {
            this->__boundMin_inf_cost = this->__boundLast_inf_cost;
          }
          dVar30 = Timer::get_operation_time((Timer *)&deg_2);
          *timeb = dVar30 + *timeb;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&vecBound_Budget);
        }
        auVar35._8_4_ = (int)((ulong)sumBudget_cost >> 0x20);
        auVar35._0_8_ = sumBudget_cost;
        auVar35._12_4_ = 0x45300000;
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_218,currDeg_1);
        dVar30 = *pvVar16;
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,currDeg_1);
        dVar30 = dVar30 * *pvVar15 +
                 (auVar35._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(sumBudget_cost,0)) - 4503599627370496.0);
        uVar22 = (ulong)dVar30;
        sumBudget_cost =
             (double)(uVar22 | (long)(dVar30 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f);
        local_444 = (value_type_conflict)currDeg_1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->__vecSeed_inf_cost,&local_444);
        pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,currDeg_1);
        miss_nodes_vec.
        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((double)miss_nodes_vec.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + *pvVar15);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_218,currDeg_1);
        *pvVar16 = 0.0;
        rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_308,currDeg_1);
        local_450 = rVar43._M_mask;
        __range4 = (value_type *)rVar43._M_p;
        std::_Bit_reference::operator=((_Bit_reference *)&__range4,true);
        deg_1 = (size_t)min_vector_nonzero_mask
                                  (budget_list,(vector<bool,_std::allocator<bool>_> *)local_308);
        pvVar8 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&(this->__hyperG)._FRsets,currDeg_1);
        __end4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar8);
        edgeIdx_1 = (unsigned_long)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar8);
        while( true ) {
          bVar29 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&edgeIdx_1);
          if (!bVar29) break;
          puVar23 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end4);
          local_478 = *puVar23;
          rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_2d8,local_478);
          local_488 = rVar43;
          bVar29 = std::_Bit_reference::operator_cast_to_bool(&local_488);
          if (!bVar29) {
            rVar43 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_2d8,local_478);
            local_490 = rVar43._M_mask;
            __range5_1 = (value_type *)rVar43._M_p;
            std::_Bit_reference::operator=((_Bit_reference *)&__range5_1,true);
            pvVar11 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[](&(this->__hyperG)._RRsets,local_478);
            __end5_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar11);
            iStack_4b0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar11);
            while( true ) {
              bVar29 = __gnu_cxx::operator!=(&__end5_1,&stack0xfffffffffffffb50);
              if (!bVar29) break;
              puVar24 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end5_1);
              degup._4_4_ = *puVar24;
              pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_218,
                                   (ulong)degup._4_4_);
              if ((*pvVar16 != 0.0) || (NAN(*pvVar16))) {
                pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)local_218,
                                     (ulong)degup._4_4_);
                dVar30 = *pvVar16;
                pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (budget_list,(ulong)degup._4_4_);
                dVar5 = *pvVar15;
                pvVar15 = std::vector<double,_std::allocator<double>_>::operator[]
                                    (budget_list,(ulong)degup._4_4_);
                dVar6 = *pvVar15;
                pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)local_218,
                                     (ulong)degup._4_4_);
                *pvVar16 = (dVar30 * dVar5 + -1.0) / dVar6;
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end5_1);
            }
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end4);
        }
        pvVar17 = std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)local_338);
        std::
        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ::pop_back(pvVar17);
        for (vecNodeup = local_338; vecNodeup != (value_type *)0x0;
            vecNodeup = (value_type *)
                        ((long)&vecNodeup[-1].
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
          idxup = (size_type)
                  std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)vecNodeup);
          local_4d0 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::size((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              *)idxup);
          while (local_4d0 != 0) {
            local_4d0 = local_4d0 - 1;
            pvVar17 = std::
                      vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                    *)&i_4,(size_type)vecNodeup);
            pvVar18 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::operator[](pvVar17,local_4d0);
            ptVar19 = std::get<0ul,unsigned_long,double>(pvVar18);
            pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_218,*ptVar19);
            vVar4 = *pvVar16;
            pvVar17 = std::
                      vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                    *)&i_4,(size_type)vecNodeup);
            pvVar18 = std::
                      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ::operator[](pvVar17,local_4d0);
            ptVar20 = std::get<1ul,unsigned_long,double>(pvVar18);
            *ptVar20 = vVar4;
          }
          local_4d0 = local_4d0 - 1;
        }
        pvVar17 = std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)local_338);
        local_4d8 = (pair<unsigned_long,_double> *)
                    std::
                    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ::begin(pvVar17);
        pvVar17 = std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)local_338);
        local_4e0 = (pair<unsigned_long,_double> *)
                    std::
                    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ::end(pvVar17);
        std::
        sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>
                  (local_4d8,local_4e0);
      }
      else {
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_218,currDeg_1);
        pVar42 = std::make_pair<unsigned_long&,double&>(&currDeg_1,pvVar16);
        local_4f0 = pVar42.second;
        finalInf_cost = (double)pVar42.first;
        std::
        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ::push_back((vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     *)&edgeMark_cost.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage,(value_type *)&finalInf_cost);
        pvVar17 = std::
                  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ::operator[]((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                *)&i_4,(size_type)local_338);
        std::
        vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ::pop_back(pvVar17);
      }
    } while ((double)miss_nodes_vec.
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + (double)deg_1 <= budget);
LAB_0010a4e5:
    std::
    vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
    ::pop_back((vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                *)&i_4);
    local_338 = (value_type *)
                ((long)&local_338[-1].
                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  } while( true );
}

Assistant:

double Alg::max_cover_lazy_budget(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    size_t maxDeg_cost = 0;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
    }

    // Normalization
    for (auto i = __numV; i--;) {
        if (int(coverage_cost[i]) + 1 > maxDeg_cost) {
            maxDeg_cost = int(coverage_cost[i]) + 1;
        }
    }
    std::cout << "maxDeg: " << maxDeg_cost << std::endl;

    // int(u.inf/u.cost) -> sort(pair<u.id, u.inf/u.cost>)
    std::vector<std::vector<std::pair<size_t, double>>> degMap_cost(maxDeg_cost + 1);
    for (auto i = __numV; i--;) {
        if (fabs(coverage_cost[i]) <= EPS) {
            continue;
        }
        degMap_cost[int(coverage_cost[i]) + 1].push_back(std::make_pair(i, coverage_cost[i]));
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // label miss nodes
    std::vector<std::pair<size_t, double>> miss_nodes_vec;
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t deg = maxDeg_cost; deg > 0; deg--) // Enusre deg > 0
    {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
            return std::get<1>(left) < std::get<1>(right);
        });
        auto & vecNode = degMap_cost[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = std::get<0>(vecNode[idx]);
            const size_t currDeg = int(coverage_cost[argmaxIdx]) + 1;
            if (deg > currDeg) {
                degMap_cost[currDeg].push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
                continue;
            }
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    int miss_idxBound = miss_nodes_vec.size() - 1;
                    bool is_stop = false;
                    for (size_t miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        std::get<1>(miss_nodes_vec[miss_idx]) = coverage_cost[std::get<0>(miss_nodes_vec[miss_idx])];
                    }
                    std::sort(miss_nodes_vec.begin(), miss_nodes_vec.end(), [](auto & left, auto & right) {
                        return std::get<1>(left) < std::get<1>(right);
                    });
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (miss_idxBound >= 0) {
                                if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                        miss_idxBound = miss_idxBound - 1;
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            else {
                                if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                    vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                }
                                else {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            std::sort(degMap_cost[degBound].begin(), degMap_cost[degBound].end(), [](auto & left, auto & right) {
                                return std::get<1>(left) < std::get<1>(right);
                            });
                            idxBound = degMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (miss_idxBound >= 0) {
                                    if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                        if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                    else {
                                        if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                            miss_idxBound = miss_idxBound - 1;
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);

                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + coverage_cost[argmaxIdx] * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (coverage_cost[nodeIdx] == 0) {
                            continue; // This node is seed, skip
                        }
                        coverage_cost[nodeIdx] = (double) (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                 budget_list[nodeIdx];
                    }
                }
                degMap_cost[deg].pop_back();
                for (auto degup = deg; degup > 0; degup--) {
                    auto & vecNodeup = degMap_cost[degup];
                    for(auto idxup = vecNodeup.size(); idxup--;) {
                        std::get<1>(degMap_cost[degup][idxup]) = coverage_cost[std::get<0>(degMap_cost[degup][idxup])];
                    }
                }
                std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
                    return std::get<1>(left) < std::get<1>(right);
                });
            }
            else{
                miss_nodes_vec.push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}